

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

VisitError<View> * __thiscall
Fixpp::visitTagView<Fixpp::TagT<115u,Fixpp::Type::String>>
          (VisitError<View> *__return_storage_ptr__,Fixpp *this,char *frame,size_t size)

{
  bool *this_00;
  TypedParsingContext<std::pair<const_char_*,_unsigned_long>_> **this_01;
  undefined1 local_100 [8];
  TypedParsingContext<std::pair<const_char_*,_unsigned_long>_> context;
  RawStreamBuf<char> streambuf;
  anon_class_16_2_24bb6e64 doVisitTag;
  StreamCursor cursor;
  
  this_00 = &context.resultValue.empty_;
  RawStreamBuf<char>::RawStreamBuf((RawStreamBuf<char> *)this_00,(char *)this,(size_t)frame);
  this_01 = &doVisitTag.context;
  doVisitTag.context = (TypedParsingContext<std::pair<const_char_*,_unsigned_long>_> *)this_00;
  StreamCursor::advance((StreamCursor *)this_01,0);
  doVisitTag.cursor = (StreamCursor *)local_100;
  context.super_ParsingContext.error.storage_.__data[0x28] = '\x01';
  context.super_ParsingContext.error.empty_ = false;
  context.super_ParsingContext.error._49_7_ = 0;
  context.super_ParsingContext.version.first = (char *)0x0;
  context.super_ParsingContext.bodyLength = 0;
  context.super_ParsingContext._84_4_ = 0;
  context.super_ParsingContext.msgType.first = (char *)0x0;
  context.super_ParsingContext.msgType.second = 0;
  context.resultValue.storage_.__data[8] = '\x01';
  local_100 = (undefined1  [8])this_01;
  streambuf.super_StreamBuf<char>._56_8_ = this_01;
  visitTagView<Fixpp::TagT<115U,_Fixpp::Type::String>_>::anon_class_16_2_24bb6e64::operator()
            ((anon_class_16_2_24bb6e64 *)&streambuf.super_StreamBuf<char>.field_0x38);
  TypedParsingContext<std::pair<const_char_*,_unsigned_long>_>::toVisitError
            (__return_storage_ptr__,
             (TypedParsingContext<std::pair<const_char_*,_unsigned_long>_> *)local_100);
  std::streambuf::~streambuf((streambuf *)&context.resultValue.empty_);
  return __return_storage_ptr__;
}

Assistant:

VisitError<View> visitTagView(const char* frame, size_t size)
    {
        RawStreamBuf<> streambuf(const_cast<char *>(frame), size);
        StreamCursor cursor(&streambuf);

        TypedParsingContext<View> context(cursor);

        auto doVisitTag = [&]() {
            do
            {
                int tag;
                TRY_MATCH_INT(
                    tag,
                    "Encountered invalid tag, expected int, got '%c'",
                    CURSOR_CURRENT(cursor)
                );
                TRY_ADVANCE("Expected value after tag %d, got EOF", tag);

                StreamCursor::Token valueToken(cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", tag);

                if (tag == Tag::Id)
                {
                    context.setValue(valueToken.view());
                    return;
                }

                cursor.advance(1);

            } while (!cursor.eof() && !context.hasError());

            context.setError(ErrorKind::UnknownTag, "Could not find tag %d in given frame", Tag::Id);
        };

        doVisitTag();

        return context.toVisitError();
    }